

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  int32_t n_runs;
  array_container_t *paVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint16_t uVar13;
  byte bVar14;
  uint uVar15;
  uint8_t uVar16;
  uint uVar17;
  uint uVar18;
  
  lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
  uVar18 = c->n_runs;
  uVar6 = (ulong)uVar18;
  iVar9 = uVar18 * 4;
  if ((*(uint *)(lVar10 + 4) & 0x20) == 0) {
    if (0 < (int)uVar18) {
      uVar8 = 0;
      do {
        uVar18 = uVar18 + c->runs[uVar8].length;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  else {
    uVar18 = _avx2_run_container_cardinality(c);
  }
  iVar11 = 0x1ffe;
  if ((int)(uVar18 * 2) < 0x1ffe) {
    iVar11 = uVar18 * 2;
  }
  uVar16 = '\x03';
  paVar5 = (array_container_t *)c;
  if (iVar11 < iVar9) {
    if ((int)uVar18 < 0x1001) {
      paVar5 = array_container_create_given_capacity(uVar18);
      paVar5->cardinality = 0;
      iVar9 = c->n_runs;
      uVar16 = '\x02';
      if (0 < (long)iVar9) {
        prVar3 = c->runs;
        puVar4 = paVar5->array;
        lVar10 = 0;
        lVar12 = 0;
        do {
          uVar13 = prVar3[lVar10].value;
          uVar1 = prVar3[lVar10].length;
          iVar11 = (int)lVar12;
          lVar12 = (long)iVar11;
          uVar18 = 0;
          do {
            puVar4[lVar12] = uVar13;
            lVar12 = lVar12 + 1;
            uVar18 = uVar18 - 1;
            uVar13 = uVar13 + 1;
          } while (~(uint)uVar1 != uVar18);
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar9);
        paVar5->cardinality = iVar11 - uVar18;
      }
    }
    else {
      paVar5 = (array_container_t *)bitset_container_create();
      iVar9 = c->n_runs;
      if (0 < (long)iVar9) {
        prVar3 = c->runs;
        puVar4 = paVar5->array;
        lVar10 = 0;
        do {
          uVar1 = prVar3[lVar10].value;
          uVar2 = prVar3[lVar10].length;
          if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
            uVar15 = (uint)uVar2 + (uint)uVar1;
            uVar7 = (uint)(uVar1 >> 6);
            uVar6 = -1L << ((byte)uVar1 & 0x3f);
            uVar17 = uVar15 >> 6;
            bVar14 = (byte)uVar15;
            if (uVar17 - uVar7 == 0) {
              bVar14 = ~bVar14;
              uVar6 = (uVar6 << (bVar14 & 0x3f)) >> (bVar14 & 0x3f);
              uVar17 = uVar7;
            }
            else {
              *(ulong *)(puVar4 + (ulong)uVar7 * 4) = *(ulong *)(puVar4 + (ulong)uVar7 * 4) | uVar6;
              if (uVar7 + 1 < uVar17) {
                memset(puVar4 + (ulong)(uVar1 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar17 - uVar7) - 2) * 8 + 8);
              }
              uVar6 = 0xffffffffffffffff >> (~bVar14 & 0x3f);
            }
            *(ulong *)(puVar4 + (ulong)uVar17 * 4) = *(ulong *)(puVar4 + (ulong)uVar17 * 4) | uVar6;
          }
          lVar10 = lVar10 + 1;
        } while (iVar9 != lVar10);
      }
      paVar5->cardinality = uVar18;
      uVar16 = '\x01';
    }
  }
  *typecode_after = uVar16;
  return paVar5;
}

Assistant:

container_t *convert_run_to_efficient_container(
    run_container_t *c,
    uint8_t *typecode_after
){
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}